

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::MapString
          (ON_wString *this,ON_Locale *locale,ON_StringMapType map_type,wchar_t *string,
          int element_count)

{
  int mapped_string_capacity_00;
  int iVar1;
  bool bVar2;
  int local_68;
  int rc;
  int mapped_string_length;
  int mapped_string_capacity;
  bool bMappingNullTerminator;
  int element_count_local;
  wchar_t *string_local;
  ON_StringMapType map_type_local;
  ON_Locale *locale_local;
  ON_wString *mapped_string;
  
  if (element_count < 0) {
    mapped_string_capacity = Length(string);
    if (mapped_string_capacity < 0) {
      ON_wString(this,&EmptyString);
      return (ON_wString)(wchar_t *)this;
    }
    bVar2 = false;
  }
  else {
    bVar2 = false;
    mapped_string_capacity = element_count;
    if ((((0 < element_count) && (bVar2 = false, string != (wchar_t *)0x0)) &&
        (bVar2 = false, string[element_count + -1] == L'\0')) && (bVar2 = true, element_count != 1))
    {
      bVar2 = string[element_count + -2] != L'\0';
    }
  }
  mapped_string_capacity_00 =
       MapString(locale,map_type,string,mapped_string_capacity,(wchar_t *)0x0,0);
  if (0 < mapped_string_capacity_00) {
    ON_wString(this);
    ReserveArray(this,(long)mapped_string_capacity_00);
    local_68 = mapped_string_capacity_00;
    if (bVar2) {
      local_68 = mapped_string_capacity_00 + -1;
    }
    SetLength(this,(long)local_68);
    iVar1 = MapString(locale,map_type,string,mapped_string_capacity,this->m_s,
                      mapped_string_capacity_00);
    if (iVar1 == mapped_string_capacity_00) {
      return (ON_wString)(wchar_t *)this;
    }
    ~ON_wString(this);
  }
  ON_wString(this,&EmptyString);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_wString::MapString(
  const class ON_Locale& locale,
  ON_StringMapType map_type,
  const wchar_t* string,
  int element_count
  )
{
  bool bMappingNullTerminator;

  if (element_count < 0)
  {
    element_count = ON_wString::Length(string);
    if ( element_count < 0 )
      return ON_wString::EmptyString;
    bMappingNullTerminator = false;
  }
  else
  {
    bMappingNullTerminator
      = element_count > 0
      && nullptr != string
      && 0 == string[element_count-1]
      && (1 == element_count || 0 != string[element_count-2])
      ;
  }

  int mapped_string_capacity = ON_wString::MapString(locale,map_type,string,element_count,nullptr,0);

  if (mapped_string_capacity > 0)
  {
    ON_wString mapped_string;

    // reserves mapped_length+1 wchar_t elements in mapped_string.m_s[]
    // and sets mapped_string.m_s[mapped_length] = 0.
    mapped_string.ReserveArray(mapped_string_capacity);

    // Set mapped_string ON_wString header length value to mapped_length.
    int mapped_string_length
      = ( bMappingNullTerminator )
      ? (mapped_string_capacity-1)
      : mapped_string_capacity;
    mapped_string.SetLength(mapped_string_length);

    int rc = ON_wString::MapString(locale,map_type,string,element_count,mapped_string.m_s,mapped_string_capacity);
    if ( rc == mapped_string_capacity )
      return mapped_string;
  }

  return ON_wString::EmptyString;
}